

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadTokenListOp(CrateReader *this,ListOp<tinyusdz::Token> *d)

{
  ulong uVar1;
  byte bVar2;
  StreamReader *pSVar3;
  bool bVar4;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> items;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_48;
  
  pSVar3 = this->_sr;
  uVar1 = pSVar3->idx_ + 1;
  if (pSVar3->length_ < uVar1) {
    ::std::__cxx11::string::append((char *)&this->_err);
    return false;
  }
  bVar2 = pSVar3->binary_[pSVar3->idx_];
  pSVar3->idx_ = uVar1;
  if ((bVar2 & 1) != 0) {
    ListOp<tinyusdz::Token>::ClearAndMakeExplicit(d);
  }
  if ((bVar2 & 2) != 0) {
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,&local_48);
    if (!bVar4) goto LAB_001b7fed;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&d->explicit_items,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_48);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_48);
  }
  if ((bVar2 & 4) != 0) {
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,&local_48);
    if (!bVar4) goto LAB_001b7fed;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&d->added_items,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_48);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_48);
  }
  if ((bVar2 & 0x20) != 0) {
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,&local_48);
    if (!bVar4) goto LAB_001b7fed;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&d->prepended_items,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_48);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_48);
  }
  if ((bVar2 & 0x40) != 0) {
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,&local_48);
    if (!bVar4) goto LAB_001b7fed;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&d->appended_items,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_48);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_48);
  }
  if ((bVar2 & 8) != 0) {
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,&local_48);
    if (!bVar4) goto LAB_001b7fed;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&d->deleted_items,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_48);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_48);
  }
  if ((bVar2 & 0x10) == 0) {
    return true;
  }
  local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)this,&local_48);
  if (bVar4) {
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&d->ordered_items,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_48);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_48);
    return true;
  }
LAB_001b7fed:
  ::std::__cxx11::string::append((char *)&this->_err);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_48);
  return false;
}

Assistant:

bool CrateReader::ReadTokenListOp(ListOp<value::token> *d) {
  // read ListOpHeader
  ListOpHeader h;
  if (!_sr->read1(&h.bits)) {
    _err += "Failed to read ListOpHeader\n";
    return false;
  }

  if (h.IsExplicit()) {
    d->ClearAndMakeExplicit();
  }

  // array data is not compressed
  auto ReadFn = [this](std::vector<value::token> &result) -> bool {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read # of elements in ListOp.\n";
      return false;
    }

    if (n > _config.maxArrayElements) {
      _err += "Too many ListOp elements.\n";
      return false;
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      _err += "Failed to read ListOp data.\n";
      return false;
    }

    // reconstruct
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto v = GetToken(ivalue[i])) {
        result[i] = v.value();
      } else {
        return false;
      }
    }

    return true;
  };

  if (h.HasExplicitItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::ExplicitItems.\n";
      return false;
    }

    d->SetExplicitItems(items);
  }

  if (h.HasAddedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::AddedItems.\n";
      return false;
    }

    d->SetAddedItems(items);
  }

  if (h.HasPrependedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::PrependedItems.\n";
      return false;
    }

    d->SetPrependedItems(items);
  }

  if (h.HasAppendedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::AppendedItems.\n";
      return false;
    }

    d->SetAppendedItems(items);
  }

  if (h.HasDeletedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::DeletedItems.\n";
      return false;
    }

    d->SetDeletedItems(items);
  }

  if (h.HasOrderedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::OrderedItems.\n";
      return false;
    }

    d->SetOrderedItems(items);
  }

  return true;
}